

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::TypeSpecializeInlineBuiltInUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,Value *src1OriginalVal,
          bool *redoTypeSpecRef)

{
  Opnd *opnd;
  code *pcVar1;
  bool bVar2;
  BuiltinFunction index;
  BuiltInFlags BVar3;
  undefined4 *puVar4;
  RegOpnd *dst;
  char *message;
  Value *pVVar5;
  OpCode originalOpCode;
  char *error;
  Value **pSrc1Val_00;
  uint lineNumber;
  uint uVar6;
  Instr *pIVar7;
  Value **ppVVar8;
  uint uVar9;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4e;
  uint local_4c;
  Value **ppVStack_48;
  int maxVal;
  uint local_3c;
  Value **ppVStack_38;
  int minVal;
  
  ppVStack_48 = pDstVal;
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1def,"(pSrc1Val)","pSrc1Val");
    if (!bVar2) goto LAB_0043694b;
    *puVar4 = 0;
  }
  bVar2 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1df2,"(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))",
                       "OpCodeAttr::IsInlineBuiltIn(instr->m_opcode)");
    if (!bVar2) goto LAB_0043694b;
    *puVar4 = 0;
  }
  index = Js::JavascriptLibrary::GetBuiltInInlineCandidateId((*pInstr)->m_opcode);
  ppVStack_38 = pSrc1Val;
  if (index._value == 'H') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1df5,"(builtInId != Js::BuiltinFunction::None)",
                       "builtInId != Js::BuiltinFunction::None");
    if (!bVar2) goto LAB_0043694b;
    *puVar4 = 0;
  }
  pSrc1Val_00 = ppVStack_38;
  BVar3 = Js::JavascriptLibrary::GetFlagsForBuiltIn(index);
  ppVVar8 = ppVStack_48;
  if ((BVar3 & BIF_Args) == BIF_TypeSpecUnaryToFloat) {
    if ((this->field_0xf5 & 0x20) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e00,"(this->DoFloatTypeSpec())","this->DoFloatTypeSpec()");
      if (!bVar2) goto LAB_0043694b;
      *puVar4 = 0;
      pSrc1Val_00 = ppVStack_38;
    }
    ppVVar8 = ppVStack_48;
    *pSrc1Val_00 = src1OriginalVal;
    bVar2 = TypeSpecializeFloatUnary(this,pInstr,src1OriginalVal,ppVStack_48,true);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e05,"(retVal)",
                         "For inline built-ins the args have to be type-specialized to float, but something failed during the process."
                        );
      if (!bVar2) goto LAB_0043694b;
      *puVar4 = 0;
      pSrc1Val_00 = ppVStack_38;
    }
    TypeSpecializeFloatDst(this,*pInstr,(Value *)0x0,*pSrc1Val_00,(Value *)0x0,ppVVar8);
    return;
  }
  pIVar7 = *pInstr;
  switch(pIVar7->m_opcode) {
  case InlineMathAbs:
    bVar2 = ValueInfo::GetIntValMinMax
                      ((*pSrc1Val_00)->valueInfo,(int *)&local_3c,(int *)&local_4c,true);
    if (!bVar2) {
      if ((*(uint *)&this->field_0xf4 >> 0xd & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e2a,"(this->DoFloatTypeSpec())","this->DoFloatTypeSpec()");
        if (!bVar2) goto LAB_0043694b;
        *puVar4 = 0;
        pSrc1Val_00 = ppVStack_38;
      }
      ppVVar8 = ppVStack_48;
      *pSrc1Val_00 = src1OriginalVal;
      bVar2 = TypeSpecializeFloatUnary(this,pInstr,src1OriginalVal,ppVStack_48,true);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e2d,"(retVal)",
                           "For inline built-ins the args have to be type-specialized (float), but something failed during the process."
                          );
        if (!bVar2) goto LAB_0043694b;
        *puVar4 = 0;
        pSrc1Val_00 = ppVStack_38;
      }
      pIVar7 = *pInstr;
      pVVar5 = *pSrc1Val_00;
LAB_004368e2:
      TypeSpecializeFloatDst(this,pIVar7,(Value *)0x0,pVVar5,(Value *)0x0,ppVVar8);
      return;
    }
    if ((*(uint *)&this->field_0xf4 >> 9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e12,"(this->DoAggressiveIntTypeSpec())",
                         "this->DoAggressiveIntTypeSpec()");
      if (!bVar2) goto LAB_0043694b;
      *puVar4 = 0;
      pSrc1Val_00 = ppVStack_38;
    }
    bVar2 = TypeSpecializeIntUnary
                      (this,pInstr,pSrc1Val_00,ppVStack_48,local_3c,local_4c,src1OriginalVal,
                       redoTypeSpecRef,true);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e14,"(retVal)",
                         "For inline built-ins the args have to be type-specialized (int), but something failed during the process."
                        );
      if (!bVar2) goto LAB_0043694b;
      *puVar4 = 0;
      pSrc1Val_00 = ppVStack_38;
    }
    uVar6 = 0x80000001;
    if (-0x7fffffff < (int)local_3c) {
      uVar6 = local_3c;
    }
    uVar9 = -uVar6;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    uVar6 = 0x80000001;
    if (-0x7fffffff < (int)local_4c) {
      uVar6 = local_4c;
    }
    local_4c = -uVar6;
    if (0 < (int)uVar6) {
      local_4c = uVar6;
    }
    if (local_4c < uVar9) {
      local_4c = uVar9;
    }
    if ((int)local_3c < 1) {
      local_3c = 0;
    }
    pIVar7 = *pInstr;
    originalOpCode = pIVar7->m_opcode;
    pVVar5 = *pSrc1Val_00;
    ppVVar8 = ppVStack_48;
    uVar6 = local_4c;
    uVar9 = local_3c;
LAB_004366a4:
    TypeSpecializeIntDst
              (this,pIVar7,originalOpCode,(Value *)0x0,pVVar5,(Value *)0x0,BailOutInvalid,uVar9,
               uVar6,ppVVar8,(AddSubConstantInfo *)0x0);
    return;
  case InlineMathClz:
    uVar6 = *(uint *)&this->field_0xf4;
    if ((uVar6 >> 9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e6d,"(this->DoAggressiveIntTypeSpec())",
                         "this->DoAggressiveIntTypeSpec()");
      if (!bVar2) goto LAB_0043694b;
      *puVar4 = 0;
      uVar6 = *(uint *)&this->field_0xf4;
      pSrc1Val_00 = ppVStack_38;
    }
    if ((uVar6 >> 0xc & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e6e,"(this->DoLossyIntTypeSpec())","this->DoLossyIntTypeSpec()");
      if (!bVar2) goto LAB_0043694b;
      *puVar4 = 0;
      pSrc1Val_00 = ppVStack_38;
    }
    bVar2 = TypeSpecializeIntUnary
                      (this,pInstr,pSrc1Val_00,ppVStack_48,-0x80000000,0x7fffffff,src1OriginalVal,
                       redoTypeSpecRef,false);
    if (bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(retVal)";
    message = "For clz32, the arg has to be type-specialized to int.";
    lineNumber = 0x1e71;
    break;
  case InlineMathCeil:
  case InlineMathFloor:
  case InlineMathRound:
    *pSrc1Val_00 = src1OriginalVal;
    bVar2 = TypeSpecializeFloatUnary(this,pInstr,src1OriginalVal,ppVStack_48,true);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e37,"(retVal)",
                         "For inline Math.floor and Math.ceil the src has to be type-specialized to float, but something failed during the process."
                        );
      if (!bVar2) goto LAB_0043694b;
      *puVar4 = 0;
      pSrc1Val_00 = ppVStack_38;
    }
    TypeSpecializeIntDst
              (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,*pSrc1Val_00,(Value *)0x0,
               BailOutInvalid,-0x80000000,0x7fffffff,ppVVar8,(AddSubConstantInfo *)0x0);
    return;
  default:
    if (pIVar7->m_opcode == InlineArrayPop) {
      opnd = pIVar7->m_src1;
      if (opnd == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e49,"(thisOpnd)","thisOpnd");
        if (!bVar2) goto LAB_0043694b;
        *puVar4 = 0;
        pIVar7 = *pInstr;
        pSrc1Val_00 = ppVStack_38;
      }
      ToVarUses(this,pIVar7,opnd,false,*pSrc1Val_00);
      if (this->prePassLoop == (Loop *)0x0) {
        local_52 = (opnd->m_valueType).field_0;
        bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_52.field_0);
        if (bVar2) {
          GenerateBailAtOperation(this,pInstr,BailOutConventionalNativeArrayAccessOnly);
        }
      }
      if ((*pInstr)->m_dst == (Opnd *)0x0) {
        return;
      }
      local_50 = (opnd->m_valueType).field_0;
      bVar2 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_50.field_0);
      if (!bVar2) {
        local_4e = (opnd->m_valueType).field_0;
        bVar2 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_4e.field_0);
        pIVar7 = *pInstr;
        if (!bVar2) {
          bVar2 = IR::Opnd::IsRegOpnd(pIVar7->m_dst);
          if (!bVar2) {
            return;
          }
          dst = IR::Opnd::AsRegOpnd((*pInstr)->m_dst);
          ToVarRegOpnd(this,dst,this->currentBlock);
          return;
        }
        pVVar5 = (Value *)0x0;
        goto LAB_004368e2;
      }
      pIVar7 = *pInstr;
      originalOpCode = pIVar7->m_opcode;
      pVVar5 = (Value *)0x0;
      uVar6 = 0x7fffffff;
      uVar9 = 0x80000000;
      goto LAB_004366a4;
    }
  case Ctz:
  case Clz:
  case InlineMathMax:
  case InlineMathImul:
  case InlineMathMin:
  case InlineMathRandom:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(0)";
    message = "Unsupported built-in!";
    lineNumber = 0x1e75;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar4 = 0;
    return;
  }
LAB_0043694b:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
GlobOpt::TypeSpecializeInlineBuiltInUnary(IR::Instr **pInstr, Value **pSrc1Val, Value **pDstVal, Value *const src1OriginalVal, bool *redoTypeSpecRef)
{
    IR::Instr *&instr = *pInstr;

    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;

    Assert(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode));

    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInInlineCandidateId(instr->m_opcode);   // From actual instr, not profile based.
    Assert(builtInId != Js::BuiltinFunction::None);

    // Consider using different bailout for float/int FromVars, so that when the arg cannot be converted to number we don't disable
    //       type spec for other parts of the big function but rather just don't inline that built-in instr.
    //       E.g. could do that if the value is not likelyInt/likelyFloat.

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
    bool areAllArgsAlwaysFloat = (builtInFlags & Js::BuiltInFlags::BIF_Args) == Js::BuiltInFlags::BIF_TypeSpecUnaryToFloat;
    if (areAllArgsAlwaysFloat)
    {
        // InlineMathAcos, InlineMathAsin, InlineMathAtan, InlineMathCos, InlineMathExp, InlineMathLog, InlineMathSin, InlineMathSqrt, InlineMathTan.
        Assert(this->DoFloatTypeSpec());

        // Type-spec the src.
        src1Val = src1OriginalVal;
        bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, /* skipDst = */ true);
        AssertMsg(retVal, "For inline built-ins the args have to be type-specialized to float, but something failed during the process.");

        // Type-spec the dst.
        this->TypeSpecializeFloatDst(instr, nullptr, src1Val, nullptr, pDstVal);
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathAbs)
    {
        // Consider the case when the value is unknown - because of bailout in abs we may disable type spec for the whole function which is too much.
        // First, try int.
        int minVal, maxVal;
        bool shouldTypeSpecToInt = src1Val->GetValueInfo()->GetIntValMinMax(&minVal, &maxVal, /* doAggressiveIntTypeSpec = */ true);
        if (shouldTypeSpecToInt)
        {
            Assert(this->DoAggressiveIntTypeSpec());
            bool retVal = this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, minVal, maxVal, src1OriginalVal, redoTypeSpecRef, true);
            AssertMsg(retVal, "For inline built-ins the args have to be type-specialized (int), but something failed during the process.");

            if (!this->IsLoopPrePass())
            {
                // Create bailout for INT_MIN which does not have corresponding int value on the positive side.
                // Check int range: if we know the range is out of overflow, we do not need the bail out at all.
                if (minVal == INT32_MIN)
                {
                    GenerateBailAtOperation(&instr, IR::BailOnIntMin);
                }
            }

            // Account for ::abs(INT_MIN) == INT_MIN (which is less than 0).
            maxVal = ::max(
                ::abs(Int32Math::NearestInRangeTo(minVal, INT_MIN + 1, INT_MAX)),
                ::abs(Int32Math::NearestInRangeTo(maxVal, INT_MIN + 1, INT_MAX)));
            minVal = minVal >= 0 ? minVal : 0;
            this->TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, src1Val, nullptr, IR::BailOutInvalid, minVal, maxVal, pDstVal);
        }
        else
        {
            // If we couldn't do int, do float.
            Assert(this->DoFloatTypeSpec());
            src1Val = src1OriginalVal;
            bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, true);
            AssertMsg(retVal, "For inline built-ins the args have to be type-specialized (float), but something failed during the process.");

            this->TypeSpecializeFloatDst(instr, nullptr, src1Val, nullptr, pDstVal);
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathFloor || instr->m_opcode == Js::OpCode::InlineMathCeil || instr->m_opcode == Js::OpCode::InlineMathRound)
    {
        // Type specialize src to float
        src1Val = src1OriginalVal;
        bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, /* skipDst = */ true);
        AssertMsg(retVal, "For inline Math.floor and Math.ceil the src has to be type-specialized to float, but something failed during the process.");

        // Type specialize dst to int
        this->TypeSpecializeIntDst(
            instr,
            instr->m_opcode,
            nullptr,
            src1Val,
            nullptr,
            IR::BailOutInvalid,
            INT32_MIN,
            INT32_MAX,
            pDstVal);
    }
    else if(instr->m_opcode == Js::OpCode::InlineArrayPop)
    {
        IR::Opnd *const thisOpnd = instr->GetSrc1();

        Assert(thisOpnd);

        // Ensure src1 (Array) is a var
        this->ToVarUses(instr, thisOpnd, false, src1Val);

        if(!this->IsLoopPrePass() && thisOpnd->GetValueType().IsLikelyNativeArray())
        {
            // We bail out, if there is illegal access or a mismatch in the Native array type that is optimized for, during the run time.
            GenerateBailAtOperation(&instr, IR::BailOutConventionalNativeArrayAccessOnly);
        }

        if(!instr->GetDst())
        {
            return;
        }

        // Try Type Specializing the element (return item from Pop) based on the array's profile data.
        if(thisOpnd->GetValueType().IsLikelyNativeIntArray())
        {
            this->TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, nullptr, nullptr, IR::BailOutInvalid, INT32_MIN, INT32_MAX, pDstVal);
        }
        else if(thisOpnd->GetValueType().IsLikelyNativeFloatArray())
        {
            this->TypeSpecializeFloatDst(instr, nullptr, nullptr, nullptr, pDstVal);
        }
        else
        {
            // We reached here so the Element is not yet type specialized. Ensure element is a var
            if(instr->GetDst()->IsRegOpnd())
            {
                this->ToVarRegOpnd(instr->GetDst()->AsRegOpnd(), currentBlock);
            }
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathClz)
    {
        Assert(this->DoAggressiveIntTypeSpec());
        Assert(this->DoLossyIntTypeSpec());
        //Type specialize to int
        bool retVal = this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, INT32_MIN, INT32_MAX, src1OriginalVal, redoTypeSpecRef);
        AssertMsg(retVal, "For clz32, the arg has to be type-specialized to int.");
    }
    else
    {
        AssertMsg(FALSE, "Unsupported built-in!");
    }
}